

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O3

int __thiscall crnlib::qdxt1::init(qdxt1 *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  dxt_pixel_block *pdVar2;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar3;
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  unkuint9 Var9;
  undefined1 auVar10 [11];
  undefined1 auVar11 [13];
  undefined1 auVar12 [14];
  undefined1 auVar13 [11];
  undefined1 auVar14 [14];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  uint6 uVar19;
  undefined1 auVar20 [16];
  bool bVar21;
  uint uVar22;
  crn_thread_id_t cVar23;
  int iVar24;
  void *in_RCX;
  uint *puVar25;
  ulong uVar26;
  uint uVar27;
  dxt_pixel_block *in_RDX;
  uint e;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  uint uVar31;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar32;
  int iVar33;
  long lVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint x;
  uint uVar38;
  int iVar39;
  uint uVar40;
  long lVar41;
  uint uVar42;
  ulong uVar43;
  uint l;
  uint uVar44;
  float *pfVar45;
  undefined4 *puVar46;
  ushort uVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [15];
  undefined4 uVar55;
  undefined4 uVar56;
  double dVar57;
  undefined4 *__x;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  color_quad_u8 h;
  color_quad_u8 c [4];
  uint encoding_hist [8];
  color_quad_u8 layout_pixels [64];
  color_quad_u8 chunk_pixels [64];
  hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  selector_hash;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_5ec;
  clusterizer<crnlib::vec<6U,_float>_> *local_5e8;
  uint local_5e0;
  float local_5dc;
  ulong local_5d8;
  mip_desc *local_5d0;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_5c8 [6];
  ulong local_5b0;
  ulong local_5a8;
  undefined4 *local_5a0;
  ulong local_598;
  long local_590;
  uint local_584;
  mip_desc *local_580;
  ulong local_578;
  ulong local_570;
  ulong local_568;
  ulong local_560;
  undefined4 *local_558;
  ulong local_550;
  ulong local_548;
  uint *local_540;
  long local_538;
  ulong local_530;
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_508 [64];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_408 [64];
  undefined1 local_308 [4];
  float afStack_304 [5];
  undefined8 local_2f0;
  long local_2c0 [82];
  
  clear(this);
  cVar23 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar23;
  this->m_num_blocks = (uint)ctx;
  this->m_pBlocks = in_RDX;
  memcpy(&this->m_params,in_RCX,0x630);
  local_5e8 = &this->m_endpoint_clusterizer;
  vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::reserve
            (&local_5e8->m_training_vecs,(uint)ctx);
  this->m_progress_start = 0;
  this->m_progress_range = 0x4b;
  if (((this->m_params).m_hierarchical == true) && ((this->m_params).m_num_mips != 0)) {
    uVar29 = this->m_num_blocks;
    uVar35 = (this->m_endpoint_clusterizer).m_training_vecs.m_size;
    if (uVar35 == uVar29) {
      local_518 = (undefined1  [16])0x0;
      local_528 = (undefined1  [16])0x0;
    }
    else {
      if (uVar35 <= uVar29) {
        if ((this->m_endpoint_clusterizer).m_training_vecs.m_capacity < uVar29) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)local_5e8,uVar29,uVar35 + 1 == uVar29,0x1c,
                     vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::object_mover,false);
          uVar35 = (this->m_endpoint_clusterizer).m_training_vecs.m_size;
        }
        auVar20 = _DAT_001a70c0;
        auVar53 = _DAT_001a7020;
        auVar51 = _DAT_001a7010;
        if (uVar29 - uVar35 != 0) {
          uVar26 = (ulong)(uVar29 - uVar35) * 0x1c - 0x1c >> 2;
          auVar59._8_8_ = 0;
          auVar59._0_8_ = uVar26;
          auVar49._8_4_ = SUB164(auVar59 * ZEXT816(0x4924924924924925),8);
          auVar49._0_8_ = SUB168(auVar59 * ZEXT816(0x4924924924924925),8);
          auVar49._12_4_ = (int)(uVar26 / 0x380000000);
          auVar50._0_8_ = uVar26 / 7;
          auVar50._8_8_ = auVar49._8_8_ >> 1;
          puVar25 = &(local_5e8->m_training_vecs).m_p[(ulong)uVar35 + 3].second;
          uVar30 = 0;
          auVar50 = auVar50 ^ _DAT_001a7020;
          do {
            auVar58._8_4_ = (int)uVar30;
            auVar58._0_8_ = uVar30;
            auVar58._12_4_ = (int)(uVar30 >> 0x20);
            auVar59 = (auVar58 | auVar51) ^ auVar53;
            iVar24 = auVar50._4_4_;
            if ((bool)(~(auVar59._4_4_ == iVar24 && auVar50._0_4_ < auVar59._0_4_ ||
                        iVar24 < auVar59._4_4_) & 1)) {
              puVar25[-0x15] = 0;
            }
            if ((auVar59._12_4_ != auVar50._12_4_ || auVar59._8_4_ <= auVar50._8_4_) &&
                auVar59._12_4_ <= auVar50._12_4_) {
              puVar25[-0xe] = 0;
            }
            auVar59 = (auVar58 | auVar20) ^ auVar53;
            iVar33 = auVar59._4_4_;
            if (iVar33 <= iVar24 && (iVar33 != iVar24 || auVar59._0_4_ <= auVar50._0_4_)) {
              puVar25[-7] = 0;
              *puVar25 = 0;
            }
            uVar30 = uVar30 + 4;
            puVar25 = puVar25 + 0x1c;
          } while ((uVar26 / 7 + 4 & 0xfffffffffffffffc) != uVar30);
        }
      }
      (this->m_endpoint_clusterizer).m_training_vecs.m_size = uVar29;
      local_518 = (undefined1  [16])0x0;
      local_528 = (undefined1  [16])0x0;
      if ((this->m_params).m_num_mips == 0) goto LAB_00137b4d;
    }
    local_518 = (undefined1  [16])0x0;
    local_528 = (undefined1  [16])0x0;
    local_5e0 = 0x200;
    uVar26 = 0;
    local_558 = &DAT_001d3674;
    uVar29 = 0;
    local_580 = (this->m_params).m_mip_desc;
    do {
      uVar22 = local_580[uVar26].m_block_width;
      uVar1 = local_580[uVar26].m_block_height;
      local_5dc = 1.5;
      if (uVar26 != 0) {
        fVar48 = powf(3.1,(float)(uVar26 & 0xffffffff));
        local_5dc = 0.25;
        if (0.25 <= 1.5 / fVar48) {
          local_5dc = 1.5 / fVar48;
        }
      }
      local_570 = uVar26;
      uVar35 = uVar1 + 1;
      if (1 < uVar35) {
        local_5d0 = local_580 + uVar26;
        local_584 = uVar22 + 1;
        uVar26 = (ulong)(uVar1 * 4 - 1);
        uVar30 = (ulong)(uVar22 * 4 - 1);
        local_568 = (ulong)(uVar35 >> 1);
        local_560 = (ulong)(local_584 >> 1);
        local_5a8 = 0;
        local_5b0 = 0;
        local_550 = uVar26;
        local_548 = uVar30;
        do {
          if (1 < local_584) {
            local_538 = local_5b0 * 8;
            local_530 = (ulong)(uint)((int)local_5b0 * 2);
            local_598 = 0;
            lVar28 = 0;
            uVar43 = 0;
            do {
              local_578 = uVar43;
              uVar22 = local_5d0->m_first_block;
              uVar1 = local_5d0->m_block_width;
              pdVar2 = this->m_pBlocks;
              paVar32 = local_408;
              lVar34 = 0;
              do {
                uVar35 = (int)local_538 + (int)lVar34;
                if ((uint)uVar26 <= uVar35) {
                  uVar35 = (uint)uVar26;
                }
                lVar41 = 0;
                do {
                  uVar42 = (int)lVar28 + (int)lVar41;
                  uVar43 = (ulong)uVar42;
                  if ((uint)uVar30 <= uVar42) {
                    uVar43 = uVar30 & 0xffffffff;
                  }
                  paVar32[lVar41] =
                       *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                        ((long)&pdVar2[(int)(uVar43 >> 2) + (uVar35 >> 2) * uVar1 + uVar22].m_pixels
                                [0][(uint)uVar43 & 3].field_0 + (ulong)((uVar35 & 3) << 4));
                  lVar41 = lVar41 + 1;
                } while (lVar41 != 8);
                lVar34 = lVar34 + 1;
                paVar32 = paVar32 + 8;
              } while (lVar34 != 8);
              local_590 = lVar28;
              pfVar45 = afStack_304 + 1;
              lVar28 = 0;
              do {
                uVar35 = (&DAT_001d3908)[lVar28 * 5];
                iVar24 = (&DAT_001d390c)[lVar28 * 5];
                if (iVar24 != 0) {
                  uVar42 = (&g_chunk_tile_layouts)[lVar28 * 5] + (&DAT_001d3904)[lVar28 * 5] * 8;
                  uVar31 = 0;
                  iVar33 = 0;
                  uVar26 = (ulong)uVar35;
                  uVar27 = uVar42;
                  uVar38 = uVar31;
                  do {
                    for (; uVar26 != 0; uVar26 = uVar26 - 1) {
                      local_508[uVar31] = local_408[uVar42];
                      uVar31 = uVar31 + 1;
                      uVar42 = uVar42 + 1;
                    }
                    iVar33 = iVar33 + 1;
                    uVar31 = uVar38 + uVar35;
                    uVar42 = uVar27 + 8;
                    uVar26 = (ulong)uVar35;
                    uVar27 = uVar42;
                    uVar38 = uVar31;
                  } while (iVar33 != iVar24);
                }
                uVar35 = iVar24 * uVar35;
                lVar34 = lVar28 * 0x50;
                dxt_fast::compress_color_block
                          (uVar35,(color_quad_u8 *)&local_508[0].field_0,
                           (uint *)(local_308 + lVar34),(uint *)(local_308 + lVar34 + 4),
                           (uint8 *)(afStack_304 + lVar28 * 0x14U + 1),false);
                dxt1_block::get_block_colors
                          ((color_quad_u8 *)&local_5c8[0].field_0,
                           (uint16)*(uint *)(local_308 + lVar34),*(uint16 *)(local_308 + lVar34 + 4)
                          );
                if (uVar35 == 0) {
                  lVar34 = 0;
                }
                else {
                  uVar26 = 0;
                  lVar34 = 0;
                  do {
                    uVar43 = (ulong)*(byte *)((long)pfVar45 + uVar26);
                    lVar34 = lVar34 + (ulong)(((uint)local_508[0].c[uVar26 * 4 + 2] -
                                              (uint)local_5c8[0].c[uVar43 * 4 + 2]) *
                                              ((uint)local_508[0].c[uVar26 * 4 + 2] -
                                              (uint)local_5c8[0].c[uVar43 * 4 + 2]) +
                                             ((uint)local_508[0].c[uVar26 * 4 + 1] -
                                             (uint)local_5c8[0].c[uVar43 * 4 + 1]) *
                                             ((uint)local_508[0].c[uVar26 * 4 + 1] -
                                             (uint)local_5c8[0].c[uVar43 * 4 + 1]) +
                                             ((uint)local_508[0].c[uVar26 * 4] -
                                             (uint)local_5c8[0].c[uVar43 * 4]) *
                                             ((uint)local_508[0].c[uVar26 * 4] -
                                             (uint)local_5c8[0].c[uVar43 * 4]));
                    uVar26 = uVar26 + 1;
                  } while (uVar35 != uVar26);
                }
                local_2c0[lVar28 * 10] = lVar34;
                lVar28 = lVar28 + 1;
                pfVar45 = pfVar45 + 0x14;
              } while (lVar28 != 9);
              uVar26 = 0;
              uVar55 = 0;
              uVar56 = 0xbff00000;
              uVar43 = 0;
              puVar46 = local_558;
              do {
                dVar57 = 999999.0;
                if ((ulong)(uint)(&g_chunk_encodings)[uVar26 * 0x15] != 0) {
                  dVar57 = 0.0;
                  lVar28 = 0;
                  do {
                    lVar34 = local_2c0[(ulong)*(uint *)((long)puVar46 + lVar28) * 10];
                    auVar51._8_4_ = (int)((ulong)lVar34 >> 0x20);
                    auVar51._0_8_ = lVar34;
                    auVar51._12_4_ = SUB164(ZEXT816(0x4530000043300000),4);
                    dVar57 = dVar57 + (auVar51._8_8_ - DAT_001abe00._8_8_) +
                                      ((double)CONCAT44(SUB164(ZEXT816(0x4530000043300000),0),
                                                        (int)lVar34) - (double)DAT_001abe00);
                    lVar28 = lVar28 + 0x14;
                  } while ((ulong)(uint)(&g_chunk_encodings)[uVar26 * 0x15] * 0x14 != lVar28);
                  __x = (undefined4 *)(dVar57 * 0.0052083334885537624);
                  local_5d8 = CONCAT44(uVar56,uVar55);
                  if ((double)__x < 0.0) {
                    local_5a0 = __x;
                    dVar52 = sqrt((double)__x);
                    uVar55 = (undefined4)local_5d8;
                    uVar56 = (undefined4)(local_5d8 >> 0x20);
                    __x = local_5a0;
                  }
                  else {
                    dVar52 = SQRT((double)__x);
                  }
                  dVar57 = 999999.0;
                  if (((double)__x != 0.0) || (NAN((double)__x))) {
                    dVar52 = log10(255.0 / dVar52);
                    uVar55 = (undefined4)local_5d8;
                    uVar56 = (undefined4)(local_5d8 >> 0x20);
                    dVar52 = dVar52 * 20.0;
                    dVar57 = 500.0;
                    if (dVar52 <= 500.0) {
                      dVar57 = dVar52;
                    }
                    dVar57 = (double)(~-(ulong)(dVar52 < 0.0) & (ulong)dVar57);
                  }
                }
                dVar57 = dVar57 - (double)(((float)((&g_chunk_encodings)[uVar26 * 0x15] - 1) / 3.0)
                                           * local_5dc + 0.0);
                if ((double)CONCAT44(uVar56,uVar55) <= dVar57 &&
                    dVar57 != (double)CONCAT44(uVar56,uVar55)) {
                  uVar43 = uVar26 & 0xffffffff;
                }
                if (dVar57 <= (double)CONCAT44(uVar56,uVar55)) {
                  dVar57 = (double)CONCAT44(uVar56,uVar55);
                }
                uVar26 = uVar26 + 1;
                puVar46 = puVar46 + 0x15;
                uVar55 = SUB84(dVar57,0);
                uVar56 = (undefined4)((ulong)dVar57 >> 0x20);
              } while (uVar26 != 8);
              *(int *)(local_528 + uVar43 * 4) = *(int *)(local_528 + uVar43 * 4) + 1;
              lVar28 = local_590;
              if ((&g_chunk_encodings)[uVar43 * 0x15] != 0) {
                local_5a0 = &DAT_001d3664 + uVar43 * 0x15;
                uVar26 = 0;
                local_540 = &g_chunk_encodings + uVar43 * 0x15;
                do {
                  puVar25 = local_5a0 + uVar26 * 5;
                  uVar35 = puVar25[3];
                  if (uVar35 == 0) {
                    uVar42 = puVar25[2];
                  }
                  else {
                    uVar42 = puVar25[2];
                    iVar24 = puVar25[1] << 3;
                    uVar27 = 0;
                    uVar31 = 0;
                    do {
                      if (uVar42 != 0) {
                        uVar36 = *puVar25 + iVar24;
                        uVar30 = (ulong)uVar42;
                        uVar38 = uVar27;
                        do {
                          local_508[uVar38] = local_408[uVar36];
                          uVar38 = uVar38 + 1;
                          uVar36 = uVar36 + 1;
                          uVar30 = uVar30 - 1;
                        } while (uVar30 != 0);
                      }
                      uVar31 = uVar31 + 1;
                      uVar27 = uVar27 + uVar42;
                      iVar24 = iVar24 + 8;
                    } while (uVar31 != uVar35);
                  }
                  local_5d8 = uVar26;
                  dxt_fast::find_representative_colors
                            (uVar42 * uVar35,(color_quad_u8 *)&local_508[0].field_0,
                             (color_quad_u8 *)&local_5c8[0].field_0,
                             (color_quad_u8 *)&local_5ec.field_0);
                  iVar24 = (local_5c8[0].m_u32 & 0xff) - (uint)local_5ec.field_0.r;
                  iVar33 = (local_5c8[0].m_u32 >> 8 & 0xff) - (uint)local_5ec.field_0.g;
                  iVar39 = (uint)(byte)local_5c8[0]._2_1_ - (uint)local_5ec.field_0.b;
                  uVar42 = iVar39 * iVar39 + iVar24 * iVar24 + iVar33 * iVar33;
                  uVar35 = (uint)((ulong)uVar42 * 0x68db8bad >> 0x2b);
                  if (7 < uVar35) {
                    uVar35 = 8;
                  }
                  if (uVar42 < 5000) {
                    uVar35 = 1;
                  }
                  uVar42 = puVar25[3];
                  if (3 < uVar42) {
                    auVar54 = ZEXT115(local_5ec.field_0.r) << 0x18 |
                              (~DAT_001abe10._0_15_ & ZEXT115((byte)local_5c8[0]._2_1_) << 0x10 |
                              ZEXT415(local_5c8[0].m_u32) & DAT_001abe10._0_15_) &
                              DAT_001abe20._0_15_;
                    Var9 = CONCAT81(SUB158(ZEXT115(0) << 0x40,7),auVar54[3]);
                    auVar17._9_6_ = 0;
                    auVar17._0_9_ = Var9;
                    auVar13._1_10_ = SUB1510(auVar17 << 0x30,5);
                    auVar13[0] = auVar54[2];
                    auVar18._11_4_ = 0;
                    auVar18._0_11_ = auVar13;
                    auVar7[2] = auVar54[1];
                    auVar7._0_2_ = auVar54._0_2_;
                    auVar7._3_12_ = SUB1512(auVar18 << 0x20,3);
                    auVar8._2_13_ = auVar7._2_13_;
                    auVar8._0_2_ = auVar54._0_2_ & 0xff;
                    auVar4._10_2_ = 0;
                    auVar4._0_10_ = auVar8._0_10_;
                    auVar4._12_2_ = (short)Var9;
                    uVar19 = CONCAT42(auVar4._10_4_,auVar13._0_2_);
                    auVar14._6_8_ = 0;
                    auVar14._0_6_ = uVar19;
                    auVar6._4_2_ = auVar7._2_2_;
                    auVar6._0_4_ = auVar8._0_4_;
                    auVar6._6_8_ = SUB148(auVar14 << 0x40,6);
                    auVar53._0_4_ = (float)(auVar8._0_4_ & 0xffff);
                    auVar53._4_4_ = (float)auVar6._4_4_;
                    auVar53._8_4_ = (float)(int)uVar19;
                    auVar53._12_4_ = (float)(auVar4._10_4_ >> 0x10);
                    uVar27 = puVar25[1];
                    uVar31 = local_5d0->m_block_height;
                    iVar24 = (int)local_5a8 + (uVar27 >> 2);
                    uVar38 = 0;
                    do {
                      if (((int)local_530 + uVar38 + (uVar27 >> 2) < uVar31) && (3 < puVar25[2])) {
                        uVar37 = puVar25[2] >> 2;
                        uVar36 = local_5d0->m_block_width;
                        ppVar3 = (local_5e8->m_training_vecs).m_p;
                        uVar40 = (*puVar25 >> 2) + (int)local_598;
                        do {
                          if (uVar36 <= uVar40) break;
                          uVar44 = uVar40 + uVar36 * iVar24 + local_5d0->m_first_block;
                          *(undefined1 (*) [16])ppVar3[uVar44].first.m_s = auVar53;
                          ppVar3[uVar44].first.m_s[4] = (float)local_5ec._1_1_;
                          ppVar3[uVar44].first.m_s[5] = (float)local_5ec._2_1_;
                          ppVar3[uVar44].second = uVar35;
                          uVar29 = uVar29 + 1;
                          uVar40 = uVar40 + 1;
                          uVar37 = uVar37 - 1;
                        } while (uVar37 != 0);
                      }
                      uVar38 = uVar38 + 1;
                      iVar24 = iVar24 + 1;
                      lVar28 = local_590;
                    } while (uVar38 != uVar42 >> 2);
                  }
                  uVar26 = local_5d8 + 1;
                  uVar30 = local_548;
                } while (uVar26 < *local_540);
              }
              uVar26 = local_550;
              if (local_5e0 <= uVar29) {
                bVar21 = update_progress(this,uVar29,this->m_num_blocks - 1);
                if (!bVar21) {
                  return 0;
                }
                local_5e0 = local_5e0 + 0x200;
              }
              uVar43 = local_578 + 1;
              lVar28 = lVar28 + 8;
              local_598 = (ulong)((int)local_598 + 2);
            } while (uVar43 != local_560);
          }
          local_5b0 = local_5b0 + 1;
          local_5a8 = (ulong)((int)local_5a8 + 2);
        } while (local_5b0 != local_568);
      }
      uVar26 = local_570 + 1;
    } while (uVar26 < (this->m_params).m_num_mips);
  }
  else {
    uVar26 = (ulong)this->m_num_blocks;
    if (this->m_num_blocks != 0) {
      lVar28 = 0;
      uVar30 = 0;
      do {
        if (((uVar30 & 0x1ff) == 0) &&
           (bVar21 = update_progress(this,(uint)uVar30,(int)uVar26 - 1), !bVar21)) {
          return 0;
        }
        dxt_fast::find_representative_colors
                  (0x10,(color_quad_u8 *)((long)&this->m_pBlocks->m_pixels[0][0].field_0 + lVar28),
                   (color_quad_u8 *)&local_408[0].field_0,(color_quad_u8 *)&local_508[0].field_0);
        iVar24 = (local_408[0].m_u32 & 0xff) - (uint)(byte)local_508[0]._0_1_;
        iVar39 = (local_408[0].m_u32 >> 8 & 0xff) - (uint)(byte)local_508[0]._1_1_;
        iVar33 = (uint)(byte)local_408[0]._2_1_ - (uint)(byte)local_508[0]._2_1_;
        uVar35 = iVar33 * iVar33 + iVar24 * iVar24 + iVar39 * iVar39;
        uVar29 = (uint)((ulong)uVar35 * 0x68db8bad >> 0x20);
        uVar22 = uVar29 >> 0xb;
        if (7 < uVar29 >> 0xb) {
          uVar22 = 8;
        }
        if (uVar35 < 5000) {
          uVar22 = 1;
        }
        auVar54 = ZEXT115((byte)local_508[0]._0_1_) << 0x18 |
                  (~DAT_001abe10._0_15_ & ZEXT115((byte)local_408[0]._2_1_) << 0x10 |
                  ZEXT415(local_408[0].m_u32) & DAT_001abe10._0_15_) & DAT_001abe20._0_15_;
        Var9 = CONCAT81(SUB158(ZEXT115(0) << 0x40,7),auVar54[3]);
        auVar15._9_6_ = 0;
        auVar15._0_9_ = Var9;
        auVar10._1_10_ = SUB1510(auVar15 << 0x30,5);
        auVar10[0] = auVar54[2];
        auVar16._11_4_ = 0;
        auVar16._0_11_ = auVar10;
        auVar11._1_12_ = SUB1512(auVar16 << 0x20,3);
        auVar11[0] = auVar54[1];
        uVar47 = CONCAT11(0,auVar54[0]);
        auVar54._2_13_ = auVar11;
        auVar54._0_2_ = uVar47;
        auVar5._10_2_ = 0;
        auVar5._0_10_ = auVar54._0_10_;
        auVar5._12_2_ = (short)Var9;
        uVar19 = CONCAT42(auVar5._10_4_,auVar10._0_2_);
        auVar12._6_8_ = 0;
        auVar12._0_6_ = uVar19;
        _local_308 = (raw_node *)
                     CONCAT44((float)(int)CONCAT82(SUB148(auVar12 << 0x40,6),auVar11._0_2_),
                              (float)uVar47);
        afStack_304[2] = (float)(auVar5._10_4_ >> 0x10);
        afStack_304[1] = (float)(int)uVar19;
        afStack_304[3] = (float)(byte)local_508[0]._1_1_;
        afStack_304[4] = (float)(byte)local_508[0]._2_1_;
        clusterizer<crnlib::vec<6U,_float>_>::add_training_vec
                  (local_5e8,(vec<6U,_float> *)local_308,uVar22);
        uVar30 = uVar30 + 1;
        uVar26 = (ulong)this->m_num_blocks;
        lVar28 = lVar28 + 0x40;
      } while (uVar30 < uVar26);
    }
  }
LAB_00137b4d:
  this->m_progress_start = 0x4b;
  this->m_progress_range = 0x14;
  lVar28 = 0;
  iVar24 = 0;
  bVar21 = clusterizer<crnlib::vec<6U,_float>_>::generate_codebook
                     (local_5e8,0xffff,generate_codebook_progress_callback,this,false);
  if (bVar21) {
    _local_308 = (raw_node *)0x0;
    afStack_304[1] = 0.0;
    afStack_304[2] = 0.0;
    afStack_304[3] = 4.48416e-44;
    local_2f0._0_4_ = 0;
    local_2f0._4_4_ = 0;
    this->m_progress_start = 0x5f;
    this->m_progress_range = 5;
    uVar26 = (ulong)this->m_num_blocks;
    if (this->m_num_blocks == 0) {
      uVar22 = 0x80;
    }
    else {
      lVar28 = 0;
      uVar30 = 0;
      do {
        if (((uVar30 & 0x1ff) == 0) &&
           (bVar21 = update_progress(this,(uint)uVar30,(int)uVar26 - 1), !bVar21)) {
          iVar24 = 0;
          goto LAB_001385bd;
        }
        dxt_fast::compress_color_block
                  ((dxt1_block *)&local_508[0].field_0,
                   (color_quad_u8 *)((long)&this->m_pBlocks->m_pixels[0][0].field_0 + lVar28),false)
        ;
        local_528._0_4_ = local_508[1];
        hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
        ::insert((insert_result *)&local_408[0].field_0,
                 (hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                  *)local_308,(uint *)local_528,(empty_type *)&local_5c8[0].field_0);
        uVar30 = uVar30 + 1;
        uVar26 = (ulong)this->m_num_blocks;
        lVar28 = lVar28 + 0x40;
      } while (uVar30 < uVar26);
      uVar22 = (uint)local_2f0 + 0x80;
    }
    this->m_max_selector_clusters = uVar22;
    iVar24 = (int)CONCAT71((int7)((ulong)lVar28 >> 8),1);
    update_progress(this,1,1);
LAB_001385bd:
    if (afStack_304[1] == 0.0) {
      if (_local_308 != (raw_node *)0x0) {
        crnlib_free(_local_308);
      }
    }
    else if (_local_308 != (raw_node *)0x0) {
      crnlib_free(_local_308);
    }
  }
  return iVar24;
}

Assistant:

bool qdxt1::init(uint n, const dxt_pixel_block* pBlocks, const qdxt1_params& params)
    {
        clear();

        CRNLIB_ASSERT(n && pBlocks);

        m_main_thread_id = crn_get_current_thread_id();

        m_num_blocks = n;
        m_pBlocks = pBlocks;
        m_params = params;

        m_endpoint_clusterizer.reserve_training_vecs(m_num_blocks);

        m_progress_start = 0;
        m_progress_range = 75;

        const bool debugging = false;
        image_u8 debug_img;

        if ((m_params.m_hierarchical) && (m_params.m_num_mips))
        {
            vec6F_clusterizer::training_vec_array& training_vecs = m_endpoint_clusterizer.get_training_vecs();
            training_vecs.resize(m_num_blocks);

            uint encoding_hist[cNumChunkEncodings];
            utils::zero_object(encoding_hist);

            uint total_processed_blocks = 0;
            uint next_progress_threshold = 512;

            for (uint level = 0; level < m_params.m_num_mips; level++)
            {
                const qdxt1_params::mip_desc& level_desc = m_params.m_mip_desc[level];

                const uint num_chunks_x = (level_desc.m_block_width + cChunkBlockWidth - 1) / cChunkBlockWidth;
                const uint num_chunks_y = (level_desc.m_block_height + cChunkBlockHeight - 1) / cChunkBlockHeight;

                const uint level_width = level_desc.m_block_width * 4;
                const uint level_height = level_desc.m_block_height * 4;

                if (debugging)
                {
                    debug_img.resize(num_chunks_x * cChunkPixelWidth, num_chunks_y * cChunkPixelHeight);
                }

                float adaptive_tile_color_psnr_derating = 1.5f; // was 2.4f
                if ((level) && (adaptive_tile_color_psnr_derating > .25f))
                {
                    adaptive_tile_color_psnr_derating = math::maximum(.25f, adaptive_tile_color_psnr_derating / powf(3.1f, static_cast<float>(level))); // was 3.0f
                }
                for (uint chunk_y = 0; chunk_y < num_chunks_y; chunk_y++)
                {
                    for (uint chunk_x = 0; chunk_x < num_chunks_x; chunk_x++)
                    {
                        color_quad_u8 chunk_pixels[cChunkPixelWidth * cChunkPixelHeight];

                        for (uint y = 0; y < cChunkPixelHeight; y++)
                        {
                            const uint pix_y = math::minimum<uint>(chunk_y * cChunkPixelHeight + y, level_height - 1);

                            const uint outer_block_index = level_desc.m_first_block + ((pix_y >> 2) * level_desc.m_block_width);

                            for (uint x = 0; x < cChunkPixelWidth; x++)
                            {
                                const uint pix_x = math::minimum<uint>(chunk_x * cChunkPixelWidth + x, level_width - 1);

                                const uint block_index = outer_block_index + (pix_x >> 2);

                                const dxt_pixel_block& block = m_pBlocks[block_index];

                                const color_quad_u8& p = block.m_pixels[pix_y & 3][pix_x & 3];

                                chunk_pixels[x + y * 8] = p;
                            }
                        }

                        struct layout_results
                        {
                            uint m_low_color;
                            uint m_high_color;
                            uint8 m_selectors[cChunkPixelWidth * cChunkPixelHeight];
                            uint64 m_error;
                            //float m_penalty;
                        };
                        layout_results layouts[cNumChunkTileLayouts];

                        for (uint l = 0; l < cNumChunkTileLayouts; l++)
                        {
                            const uint width = g_chunk_tile_layouts[l].m_width;
                            const uint height = g_chunk_tile_layouts[l].m_height;
                            const uint x_ofs = g_chunk_tile_layouts[l].m_x_ofs;
                            const uint y_ofs = g_chunk_tile_layouts[l].m_y_ofs;

                            color_quad_u8 layout_pixels[cChunkPixelWidth * cChunkPixelHeight];
                            for (uint y = 0; y < height; y++)
                            {
                                for (uint x = 0; x < width; x++)
                                {
                                    layout_pixels[x + y * width] = chunk_pixels[(x_ofs + x) + (y_ofs + y) * cChunkPixelWidth];
                                }
                            }

                            const uint n = width * height;
                            dxt_fast::compress_color_block(n, layout_pixels, layouts[l].m_low_color, layouts[l].m_high_color, layouts[l].m_selectors);

                            color_quad_u8 c[4];
                            dxt1_block::get_block_colors(c, static_cast<uint16>(layouts[l].m_low_color), static_cast<uint16>(layouts[l].m_high_color));

                            uint64 error = 0;
                            for (uint i = 0; i < n; i++)
                            {
                                error += color::elucidian_distance(layout_pixels[i], c[layouts[l].m_selectors[i]], false);
                            }

                            layouts[l].m_error = error;

#if 0
                     if ((width > 4) || (height > 4))
                     {
                        const uint dist = color::elucidian_distance(
                           dxt1_block::unpack_color(static_cast<uint16>(layouts[l].m_low_color), true),
                           dxt1_block::unpack_color(static_cast<uint16>(layouts[l].m_high_color), true), false);

                        layouts[l].m_penalty = math::clamp((sqrt((float)dist) - 75.0f) / 150.0f, 0.0f, 2.0f);
                        if ((width == 8) && (height == 8))
                           layouts[l].m_penalty *= 2.0f;
                     }
                     else
                     {
                        layouts[l].m_penalty = 0.0f;
                     }
#endif
                        }

                        double best_peak_snr = -1.0f;
                        uint best_encoding = 0;

                        for (uint e = 0; e < cNumChunkEncodings; e++)
                        {
                            const chunk_encoding_desc& encoding_desc = g_chunk_encodings[e];

                            double total_error = 0;

                            for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                            {
                                total_error += (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_error;
                            }

                            //double mean_squared = total_error * (1.0f / (16.0f * 3.0f));
                            double mean_squared = total_error * (1.0f / (64.0f * 3.0f));
                            double root_mean_squared = sqrt(mean_squared);

                            double peak_snr = 999999.0f;
                            if (mean_squared)
                            {
                                peak_snr = math::clamp<double>(log10(255.0f / root_mean_squared) * 20.0f, 0.0f, 500.0f);
                            }

                            //if (level)
                            //   adaptive_tile_color_psnr_derating = math::lerp(adaptive_tile_color_psnr_derating * .5f, .3f, math::maximum((level - 1) / float(m_params.m_num_mips - 2), 1.0f));

                            float color_derating = math::lerp(0.0f, adaptive_tile_color_psnr_derating, (g_chunk_encodings[e].m_num_tiles - 1) / 3.0f);
                            peak_snr = peak_snr - color_derating;

                            //for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                            //   peak_snr -= (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_penalty;

                            if (peak_snr > best_peak_snr)
                            {
                                best_peak_snr = peak_snr;
                                best_encoding = e;
                            }
                        }

                        encoding_hist[best_encoding]++;

                        const chunk_encoding_desc& encoding_desc = g_chunk_encodings[best_encoding];

                        for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                        {
                            const chunk_tile_desc& tile_desc = encoding_desc.m_tiles[t];

                            uint layout_index = tile_desc.m_layout_index;
                            const layout_results& layout = layouts[layout_index];
                            color_quad_u8 c[4];
                            if (debugging)
                            {
                                dxt1_block::get_block_colors(c, static_cast<uint16>(layout.m_low_color), static_cast<uint16>(layout.m_high_color));
                            }

                            color_quad_u8 tile_pixels[cChunkPixelWidth * cChunkPixelHeight];

                            for (uint y = 0; y < tile_desc.m_height; y++)
                            {
                                const uint pix_y = y + tile_desc.m_y_ofs;

                                for (uint x = 0; x < tile_desc.m_width; x++)
                                {
                                    const uint pix_x = x + tile_desc.m_x_ofs;

                                    tile_pixels[x + y * tile_desc.m_width] = chunk_pixels[pix_x + pix_y * cChunkPixelWidth];

                                    if (debugging)
                                    {
                                        debug_img(chunk_x * 8 + pix_x, chunk_y * 8 + pix_y) = c[layout.m_selectors[x + y * tile_desc.m_width]];
                                    }
                                }
                            }

                            color_quad_u8 l, h;
                            dxt_fast::find_representative_colors(tile_desc.m_width * tile_desc.m_height, tile_pixels, l, h);

                            //const uint dist = color::color_distance(m_params.m_perceptual, l, h, false);
                            const uint dist = color::elucidian_distance(l, h, false);

                            const uint cColorDistToWeight = 5000;
                            const uint cMaxWeight = 8;
                            uint weight = math::clamp<uint>(dist / cColorDistToWeight, 1, cMaxWeight);

                            vec6F ev;

                            ev[0] = l[0];
                            ev[1] = l[1];
                            ev[2] = l[2];
                            ev[3] = h[0];
                            ev[4] = h[1];
                            ev[5] = h[2];

                            for (uint y = 0; y < (tile_desc.m_height >> 2); y++)
                            {
                                uint block_y = chunk_y * cChunkBlockHeight + y + (tile_desc.m_y_ofs >> 2);
                                if (block_y >= level_desc.m_block_height)
                                {
                                    continue;
                                }

                                for (uint x = 0; x < (tile_desc.m_width >> 2); x++)
                                {
                                    uint block_x = chunk_x * cChunkBlockWidth + x + (tile_desc.m_x_ofs >> 2);
                                    if (block_x >= level_desc.m_block_width)
                                    {
                                        break;
                                    }

                                    uint block_index = level_desc.m_first_block + block_x + block_y * level_desc.m_block_width;

                                    training_vecs[block_index].first = ev;
                                    training_vecs[block_index].second = weight;

                                    total_processed_blocks++;

                                    //if (debugging)
                                    //{
                                    //   debug_img(block_x, block_y) = l;
                                    //   debug_img(block_x + level_desc.m_block_width, block_y) = h;
                                    //}

                                } // x
                            } // y
                        } //t

                        if (total_processed_blocks >= next_progress_threshold)
                        {
                            next_progress_threshold += 512;

                            if (!update_progress(total_processed_blocks, m_num_blocks - 1))
                            {
                                return false;
                            }
                        }

                    } // chunk_x
                } // chunk_y

#if GENERATE_DEBUG_IMAGES
                if (debugging)
                    image_utils::write_to_file(dynamic_string(cVarArg, "debug_%u.tga", level).get_ptr(), debug_img, image_utils::cWriteFlagIgnoreAlpha);
#endif

            } // level

#if 0
         trace("chunk encoding hist: ");
         for (uint i = 0; i < cNumChunkEncodings; i++)
            trace("%u ", encoding_hist[i]);
         trace("\n");
#endif
        }
        else
        {
            for (uint block_index = 0; block_index < m_num_blocks; block_index++)
            {
                if ((block_index & 511) == 0)
                {
                    if (!update_progress(block_index, m_num_blocks - 1))
                    {
                        return false;
                    }
                }

                color_quad_u8 l, h;
                dxt_fast::find_representative_colors(cDXTBlockSize * cDXTBlockSize, &m_pBlocks[block_index].m_pixels[0][0], l, h);

                //const uint dist = color::color_distance(m_params.m_perceptual, l, h, false);
                const uint dist = color::elucidian_distance(l, h, false);

                const uint cColorDistToWeight = 5000;
                const uint cMaxWeight = 8;
                uint weight = math::clamp<uint>(dist / cColorDistToWeight, 1, cMaxWeight);

                vec6F ev;

                ev[0] = l[0];
                ev[1] = l[1];
                ev[2] = l[2];
                ev[3] = h[0];
                ev[4] = h[1];
                ev[5] = h[2];

                m_endpoint_clusterizer.add_training_vec(ev, weight);
            }
        }

        const uint cMaxEndpointClusters = 65535U;

        m_progress_start = 75;
        m_progress_range = 20;

        if (!m_endpoint_clusterizer.generate_codebook(cMaxEndpointClusters, generate_codebook_progress_callback, this))
        {
            return false;
        }

        crnlib::hash_map<uint, empty_type> selector_hash;

        m_progress_start = 95;
        m_progress_range = 5;

        for (uint block_index = 0; block_index < m_num_blocks; block_index++)
        {
            if ((block_index & 511) == 0)
            {
                if (!update_progress(block_index, m_num_blocks - 1))
                {
                    return false;
                }
            }

            dxt1_block dxt_blk;
            dxt_fast::compress_color_block(&dxt_blk, &m_pBlocks[block_index].m_pixels[0][0]);

            uint selectors = dxt_blk.m_selectors[0] | (dxt_blk.m_selectors[1] << 8) | (dxt_blk.m_selectors[2] << 16) | (dxt_blk.m_selectors[3] << 24);

            selector_hash.insert(selectors);
        }

        m_max_selector_clusters = selector_hash.size() + 128;

        //      trace("max endpoint clusters: %u\n", m_endpoint_clusterizer.get_codebook_size());
        //      trace("max selector clusters: %u\n", m_max_selector_clusters);

        update_progress(1, 1);

        return true;
    }